

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int CheckInventory(AActor *activator,char *type,bool max)

{
  PClass *pPVar1;
  int iVar2;
  PClass *pPVar3;
  PClassActor *type_00;
  AInventory *pAVar4;
  PClassActor *pPVar5;
  char *format;
  bool bVar6;
  undefined4 extraout_var;
  
  if (type == (char *)0x0 || activator == (AActor *)0x0) {
    return 0;
  }
  iVar2 = strcasecmp(type,"Armor");
  if (iVar2 == 0) {
    type = "BasicArmor";
  }
  else {
    iVar2 = strcasecmp(type,"Health");
    pPVar1 = APlayerPawn::RegistrationInfo.MyClass;
    if (iVar2 == 0) {
      if (!max) {
        return activator->health;
      }
      pPVar3 = (activator->super_DThinker).super_DObject.Class;
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
        pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
        (activator->super_DThinker).super_DObject.Class = pPVar3;
      }
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar1 && bVar6) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar6 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar1) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (bVar6) {
        return *(int *)&activator[1].super_DThinker.super_DObject._vptr_DObject;
      }
      iVar2 = AActor::SpawnHealth(activator);
      return iVar2;
    }
  }
  type_00 = PClass::FindActor(type);
  if (type_00 == (PClassActor *)0x0) {
    format = "ACS: \'%s\': Unknown actor class.\n";
LAB_003c2bd9:
    DPrintf(1,format,type);
    return 0;
  }
  pPVar5 = type_00;
  if (type_00 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
    do {
      pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
      if (pPVar5 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
    } while (pPVar5 != (PClassActor *)0x0);
    if (pPVar5 == (PClassActor *)0x0) {
      format = "ACS: \'%s\' is not an inventory item.\n";
      goto LAB_003c2bd9;
    }
  }
  iVar2 = 0;
  pAVar4 = AActor::FindInventory(activator,type_00,false);
  if (max) {
    if (pAVar4 == (AInventory *)0x0) {
      pPVar5 = type_00;
      if (type_00 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
        do {
          pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
          if (pPVar5 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar5 != (PClassActor *)0x0);
        if (pPVar5 == (PClassActor *)0x0) goto LAB_003c2bbb;
      }
      pAVar4 = (AInventory *)(type_00->super_PClass).Defaults;
    }
    iVar2 = pAVar4->MaxAmount;
  }
  else {
LAB_003c2bbb:
    if (pAVar4 != (AInventory *)0x0) {
      iVar2 = pAVar4->Amount;
    }
  }
  return iVar2;
}

Assistant:

static int CheckInventory (AActor *activator, const char *type, bool max)
{
	if (activator == NULL || type == NULL)
		return 0;

	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	else if (stricmp (type, "Health") == 0)
	{
		if (max)
		{
			if (activator->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
				return static_cast<APlayerPawn *>(activator)->MaxHealth;
			else
				return activator->SpawnHealth();
		}
		return activator->health;
	}

	PClassActor *info = PClass::FindActor (type);

	if (info == NULL)
	{
		DPrintf (DMSG_ERROR, "ACS: '%s': Unknown actor class.\n", type);
		return 0;
	}
	else if (!info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
	{
		DPrintf(DMSG_ERROR, "ACS: '%s' is not an inventory item.\n", type);
		return 0;
	}

	AInventory *item = activator->FindInventory (info);

	if (max)
	{
		if (item)
		{
			return item->MaxAmount;
		}
		else if (info != nullptr && info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			return ((AInventory *)GetDefaultByType(info))->MaxAmount;
		}
	}
	return item ? item->Amount : 0;
}